

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O2

void dynamic_api_suite::run(void)

{
  api_ctor_default();
  api_ctor_move();
  api_ctor_array();
  api_ctor_iterator();
  api_empty();
  api_full();
  api_size();
  api_capacity();
  api_clear();
  api_insert_value();
  api_remove_iterator();
  api_lower_bound();
  api_begin_end();
  api_begin_end_const();
  api_cbegin_cend();
  api_key_comp();
  return;
}

Assistant:

void run()
{
    api_ctor_default();
    api_ctor_move();
    api_ctor_array();
    api_ctor_iterator();
    api_empty();
    api_full();
    api_size();
    api_capacity();
    api_clear();
    api_insert_value();
    api_remove_iterator();
    api_lower_bound();
    api_begin_end();
    api_begin_end_const();
    api_cbegin_cend();
    api_key_comp();
}